

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::localReportIter(HEkkPrimal *this,bool header)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  HEkk *pHVar5;
  HEkk *pHVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  double dVar12;
  
  if (this->report_hyper_chuzc == true) {
    pHVar5 = this->ekk_instance_;
    uVar9 = pHVar5->iteration_count_;
    if (!header) {
      if (this->last_header_iteration_count_ + 10 < (int)uVar9) {
        puts(" Iter ColIn Row_Out ColOut");
        this->last_header_iteration_count_ = uVar9;
      }
      if (this->row_out < 0) {
        printf("%5d %5d Bound flip   ",(ulong)uVar9,(ulong)(uint)this->variable_in);
      }
      else {
        printf("%5d %5d  %5d  %5d",(ulong)uVar9,(ulong)(uint)this->variable_in,
               (ulong)(uint)this->row_out,(ulong)(uint)this->variable_out);
      }
      lVar11 = (long)this->check_column;
      if ((-1 < lVar11) && (this->check_iter <= (int)uVar9)) {
        pHVar6 = this->ekk_instance_;
        uVar9 = (uint)(pHVar6->basis_).nonbasicFlag_.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11];
        uVar10 = (uint)(pHVar6->basis_).nonbasicMove_.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar11];
        dVar12 = (pHVar5->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        dVar1 = (pHVar5->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar11];
        if (uVar9 == 1) {
          printf(": Var %2d (%1d, %2d) [%9.4g, %9.4g, %9.4g]",dVar12,
                 (pHVar5->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar11],lVar11,(ulong)uVar9,(ulong)uVar10)
          ;
          dVar2 = (pHVar5->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[this->check_column];
          dVar3 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[this->check_column];
          if (dVar12 == -INFINITY && dVar1 == INFINITY) {
            dVar12 = ABS(dVar2);
          }
          else {
            dVar12 = (double)(int)-uVar10 * dVar2;
          }
          dVar12 = (double)(~-(ulong)(dVar12 < this->dual_feasibility_tolerance) & (ulong)dVar12);
          printf(" Du = %9.4g; Wt = %9.4g; Ms = %9.4g",dVar2,dVar3,(dVar12 * dVar12) / dVar3);
        }
        else {
          uVar4 = this->num_row;
          if ((int)uVar4 < 1) {
            uVar7 = 0;
          }
          else {
            uVar8 = 0;
            do {
              uVar7 = uVar8;
              if ((pHVar6->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8] == this->check_column) break;
              uVar8 = uVar8 + 1;
              uVar7 = (ulong)uVar4;
            } while (uVar4 != uVar8);
            uVar7 = uVar7 & 0xffffffff;
          }
          printf(": Var %2d (%1d, %2d) [%9.4g, %9.4g, %9.4g]",dVar12,
                 (pHVar5->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7],lVar11,(ulong)uVar9,(ulong)uVar10);
        }
      }
      putchar(10);
      return;
    }
    puts(" Iter ColIn Row_Out ColOut");
    this->last_header_iteration_count_ = uVar9;
  }
  return;
}

Assistant:

void HEkkPrimal::localReportIter(const bool header) {
  if (!report_hyper_chuzc) return;
  const HighsSimplexInfo& info = ekk_instance_.info_;
  HighsInt iteration_count = ekk_instance_.iteration_count_;
  if (header) {
    localReportIterHeader();
    last_header_iteration_count_ = iteration_count;
  } else {
    if (ekk_instance_.iteration_count_ > last_header_iteration_count_ + 10) {
      localReportIterHeader();
      last_header_iteration_count_ = iteration_count;
    }
    if (row_out >= 0) {
      printf("%5" HIGHSINT_FORMAT " %5" HIGHSINT_FORMAT "  %5" HIGHSINT_FORMAT
             "  %5" HIGHSINT_FORMAT "",
             iteration_count, variable_in, row_out, variable_out);
    } else {
      printf("%5" HIGHSINT_FORMAT " %5" HIGHSINT_FORMAT " Bound flip   ",
             iteration_count, variable_in);
    }
    if (check_column >= 0 && iteration_count >= check_iter) {
      HighsInt flag = ekk_instance_.basis_.nonbasicFlag_[check_column];
      HighsInt move = ekk_instance_.basis_.nonbasicMove_[check_column];
      double lower = info.workLower_[check_column];
      double upper = info.workUpper_[check_column];
      double value;
      if (flag == kNonbasicFlagTrue) {
        value = info.workValue_[check_column];
      } else {
        HighsInt iRow;
        for (iRow = 0; iRow < num_row; iRow++) {
          if (ekk_instance_.basis_.basicIndex_[iRow] == check_column) break;
        }
        assert(iRow < num_row);
        value = info.baseValue_[iRow];
      }
      printf(": Var %2" HIGHSINT_FORMAT " (%1" HIGHSINT_FORMAT
             ", %2" HIGHSINT_FORMAT ") [%9.4g, %9.4g, %9.4g]",
             check_column, flag, move, lower, value, upper);
      if (flag == kNonbasicFlagTrue) {
        double dual = info.workDual_[check_column];
        double weight = edge_weight_[check_column];
        double infeasibility = -move * dual;
        if (lower == -kHighsInf && upper == kHighsInf)
          infeasibility = fabs(dual);
        if (infeasibility < dual_feasibility_tolerance) infeasibility = 0;
        double measure = infeasibility * infeasibility / weight;
        printf(" Du = %9.4g; Wt = %9.4g; Ms = %9.4g", dual, weight, measure);
      }
    }
    printf("\n");
  }
}